

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_viewOps.cpp
# Opt level: O0

string_view
gmlc::utilities::string_viewOps::getTailString_any
          (string_view input,string_view separationCharacters)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  string_view sVar1;
  size_type sVar2;
  size_t in_RCX;
  basic_string_view<char,_std::char_traits<char>_> *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  size_type sepLoc;
  size_type in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffc0;
  basic_string_view<char,_std::char_traits<char>_> local_28 [2];
  
  __str._M_str = in_stack_ffffffffffffffc0;
  __str._M_len = in_RCX;
  local_28[0]._M_len = in_RDI;
  local_28[0]._M_str = in_RSI;
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find_last_of
                    (in_RDX,__str,in_stack_ffffffffffffffa8);
  if (sVar2 != 0xffffffffffffffff) {
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix(local_28,sVar2 + 1);
  }
  sVar1._M_str = local_28[0]._M_str;
  sVar1._M_len = local_28[0]._M_len;
  return sVar1;
}

Assistant:

std::string_view getTailString_any(
    std::string_view input,
    std::string_view separationCharacters) noexcept
{
    auto sepLoc = input.find_last_of(separationCharacters);
    if (sepLoc != std::string_view::npos) {
        input.remove_prefix(sepLoc + 1);
    }
    return input;
}